

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O3

void gutil::getFileList(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *list,string *prefix,string *suffix)

{
  pointer pcVar1;
  ulong uVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  long lVar5;
  IOException *this;
  _Alloc_hider __name;
  string name;
  string pref;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_98;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_98 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)list;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_90 = local_80;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + prefix->_M_string_length);
  uVar2 = std::__cxx11::string::find_last_of((char *)&local_90,0x10d388,0xffffffffffffffff);
  if (uVar2 < local_88) {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  __name._M_p = local_70._M_dataplus._M_p;
  if (local_70._M_string_length == 0) {
    __name._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x10d077;
  }
  __dirp = opendir(__name._M_p);
  if (__dirp != (DIR *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        sVar4 = strlen(pdVar3->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,pdVar3->d_name,pdVar3->d_name + sVar4);
        if (((suffix->_M_string_length + local_88 <= local_b8._M_string_length) &&
            (lVar5 = std::__cxx11::string::find((char *)&local_b8,(ulong)local_90,0), lVar5 == 0))
           && ((suffix->_M_string_length == 0 ||
               (lVar5 = std::__cxx11::string::rfind
                                  ((char *)&local_b8,(ulong)(suffix->_M_dataplus)._M_p,
                                   0xffffffffffffffff),
               lVar5 == local_b8._M_string_length - suffix->_M_string_length)))) {
          std::operator+(&local_50,&local_70,&local_b8);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>(local_98,&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        pdVar3 = readdir(__dirp);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir(__dirp);
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_b8,"Cannot open directory: ",&local_70);
  IOException::IOException(this,&local_b8);
  __cxa_throw(this,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

void gutil::getFileList(std::set<std::string> &list, const std::string &prefix,
                        const std::string &suffix)
{
#ifdef __GNUC__
  std::string dir="", pref=prefix;
  size_t pos=pref.find_last_of("/\\");

  if (pos < pref.size())
  {
    dir=pref.substr(0, pos+1);
    pref=pref.substr(pos+1);
  }

  DIR *p;

  if (dir.size() > 0)
  {
    p=opendir(dir.c_str());
  }
  else
  {
    p=opendir(".");
  }

  if (p == 0)
  {
    throw IOException("Cannot open directory: "+dir);
  }

  list.clear();

  struct dirent *entry=readdir(p);

  while (entry != 0)
  {
    std::string name=entry->d_name;

    if (name.size() >= pref.size()+suffix.size() &&
        name.find(pref) ==  0 && (suffix.size() == 0 ||
                                  name.rfind(suffix) == name.size()-suffix.size()))
    {
      list.insert(dir+name);
    }

    entry=readdir(p);
  }

  closedir(p);
#elif defined(WIN32)
  std::string dir="";
  size_t pos=prefix.find_last_of("/\\");

  if (pos < prefix.size())
  {
    dir=prefix.substr(0, pos+1);
  }

  HANDLE p;
  WIN32_FIND_DATA data;

  list.clear();

  p=FindFirstFileA((prefix+"*"+suffix).c_str(), &data);

  if (p != INVALID_HANDLE_VALUE)
  {
    do
    {
      list.insert(dir+data.cFileName);
    }
    while (FindNextFileA(p, &data));

    FindClose(p);
  }

#else
  assert(false);
#endif
}